

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O3

void printTimeForDebug(int choice,time_t start,time_t finish)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ofstream outfile;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  pcVar2 = catStrStr(draftAddress,"time.txt");
  std::ofstream::ofstream(&local_228,pcVar2,_S_app);
  if ((uint)choice < 7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,(&PTR_anon_var_dwarf_3d09_00108d78)[(uint)choice],
               *(long *)(&DAT_00106328 + (ulong)(uint)choice * 8));
  }
  lVar5 = finish - start;
  auVar1 = SEXT816(lVar5 / 0x3c) * ZEXT816(0x8888888888888889);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&local_228,
                      (int)(SUB168(SEXT816(lVar5) * SEXT816(0x48d159e26af37c05),8) >> 10) -
                      (SUB164(SEXT816(lVar5) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  iVar6 = (int)(lVar5 / 0x3c);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,iVar6 + ((int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f)) * -0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,(int)lVar5 + iVar6 * -0x3c);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _system;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void printTimeForDebug(int choice, time_t start, time_t finish){
    const char *timeFile = catStrStr(draftAddress, "time.txt");
    ofstream outfile(timeFile, ios::app);
    long duration;
    duration = finish-start;
    switch (choice){
        case 0: outfile << "TOTAL Time: \n"; break;
        case 1: outfile << "Cost 1 : "; break;
        case 2: outfile << "Cost 2 : "; break;
        case 3: outfile << "Transfer Time: "; break;
        case 4: outfile << "Input Time: "; break;
        case 5: outfile << "Adaption Time: "; break;
        case 6: outfile << "IntoRep Time: "; break;
        default: break;
    }
    int seconds = duration % 60;
    duration /= 60;
    int minutes = duration % 60;
    duration /= 60;
    int hours = duration;

    outfile << hours << ":" << minutes << ":" << seconds << endl;
    outfile.close();
}